

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::SharedCtor(Options *this)

{
  string *psVar1;
  ArenaStringPtr *this_00;
  long in_RDI;
  SCCInfoBase *in_stack_ffffffffffffffe8;
  
  google::protobuf::internal::InitSCC(in_stack_ffffffffffffffe8);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            ((ArenaStringPtr *)(in_RDI + 0xa8),psVar1);
  this_00 = (ArenaStringPtr *)(in_RDI + 0xb0);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(this_00,psVar1);
  memset((void *)(in_RDI + 0xb8),0,0x20);
  *(undefined8 *)(in_RDI + 0xd8) = 0x14;
  return;
}

Assistant:

void Options::SharedCtor() {
  ::PROTOBUF_NAMESPACE_ID::internal::InitSCC(&scc_info_Options_bloaty_2eproto.base);
  disassemble_function_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  source_filter_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ::memset(&demangle_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&debug_fileoff_) -
      reinterpret_cast<char*>(&demangle_)) + sizeof(debug_fileoff_));
  max_rows_per_level_ = PROTOBUF_LONGLONG(20);
}